

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

int find_conflict_base(int cbase)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  int *piVar7;
  
  uVar3 = 0;
  uVar4 = 0;
  piVar5 = conflicts;
  if (0 < cbase) {
    uVar4 = (ulong)(uint)cbase;
  }
  do {
    lVar6 = (long)cbase;
    piVar7 = piVar5;
    if (uVar3 == uVar4) {
      return cbase;
    }
    do {
      if (nconflicts <= lVar6) {
        return (int)uVar3;
      }
      iVar2 = *piVar7;
      piVar1 = conflicts + lVar6;
      lVar6 = lVar6 + 1;
      piVar7 = piVar7 + 1;
    } while (iVar2 == *piVar1);
    uVar3 = uVar3 + 1;
    piVar5 = piVar5 + 1;
  } while( true );
}

Assistant:

int find_conflict_base(int cbase)
{
    int i,j;

    for (i=0; i<cbase; i++) {
	for (j=0; j+cbase < nconflicts; j++) {
	    if (conflicts[i+j] != conflicts[cbase+j])
		break; }
	if (j+cbase >= nconflicts)
	    return i; }
    return cbase;
}